

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O1

void __thiscall YM3812::YM3812(YM3812 *this,bool stereo)

{
  ulong uVar1;
  UINT32 *pUVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPLEmul_006f30c0;
  if (init_tables()::did_init == '\0') {
    piVar7 = tl_tab;
    lVar8 = 0;
    do {
      lVar10 = lVar8 + 1;
      dVar11 = exp2((double)(int)lVar10 * -0.00390625);
      dVar11 = floor(dVar11 * 65536.0);
      uVar4 = ((int)dVar11 >> 4) + 1U & 0xfffffffe;
      tl_tab[lVar8 * 2] = uVar4;
      tl_tab[lVar8 * 2 + 1] = -uVar4;
      lVar6 = 0x804;
      bVar3 = 1;
      do {
        *(int *)((long)piVar7 + lVar6 + -4) = tl_tab[lVar8 * 2] >> (bVar3 & 0x1f);
        *(int *)((long)piVar7 + lVar6) = (0 >> (bVar3 & 0x1f)) - tl_tab[lVar8 * 2] >> (bVar3 & 0x1f)
        ;
        lVar6 = lVar6 + 0x800;
        bVar3 = bVar3 + 1;
      } while (lVar6 != 0x6004);
      piVar7 = piVar7 + 2;
      lVar8 = lVar10;
    } while (lVar10 != 0x100);
    iVar9 = 1;
    lVar8 = 0;
    do {
      dVar11 = sin((double)iVar9 * 0.0030679615757712823);
      dVar12 = log(*(double *)(&DAT_005df4c0 + (ulong)(0.0 < dVar11) * 8) / dVar11);
      *(uint *)((long)sin_tab + lVar8) =
           (uint)(dVar11 < 0.0) | (int)(dVar12 * 738.6598609351493) + 1U & 0xfffffffe;
      lVar8 = lVar8 + 4;
      iVar9 = iVar9 + 2;
    } while (lVar8 != 0x1000);
    uVar1 = 0;
    do {
      uVar5 = 0x1800;
      uVar4 = 0x1800;
      if (uVar1 < 0x200) {
        uVar4 = sin_tab[uVar1];
      }
      sin_tab[uVar1 + 0x400] = uVar4;
      sin_tab[uVar1 + 0x800] = sin_tab[(uint)uVar1 & 0x1ff];
      if (((uint)uVar1 >> 8 & 1) == 0) {
        uVar5 = sin_tab[uVar1 & 0xff];
      }
      sin_tab[uVar1 + 0xc00] = uVar5;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x400);
    init_tables()::did_init = '\x01';
  }
  lVar8 = 0;
  memset(&this->Chip,0,0x17e0);
  pUVar2 = (this->Chip).fn_tab;
  do {
    *pUVar2 = (UINT32)(long)((double)(int)lVar8 * 63.99987484467331);
    lVar8 = lVar8 + 0x40;
    pUVar2 = pUVar2 + 1;
  } while (lVar8 != 0x10000);
  (this->Chip).lfo_am_inc = 0x3ffff;
  (this->Chip).lfo_pm_inc = 0x3fff;
  (this->Chip).eg_timer_add = 0xffff;
  (this->Chip).eg_timer_overflow = 0x10000;
  (this->Chip).IsStereo = false;
  lVar8 = 0xdc;
  do {
    *(undefined8 *)((long)(this->Chip).P_CH[0].SLOT[0].op1_out + lVar8 + -0x34) = 0x3f3504f33f3504f3
    ;
    lVar8 = lVar8 + 0xd8;
  } while (lVar8 != 0x874);
  (this->Chip).IsStereo = stereo;
  Reset(this);
  return;
}

Assistant:

YM3812(bool stereo)
	{
		init_tables();

		/* clear */
		memset(&Chip, 0, sizeof(Chip));

		/* init global tables */
		OPL_initalize(&Chip);

		Chip.IsStereo = stereo;

		Reset();
	}